

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CacheYouhuaMain.cpp
# Opt level: O1

bool parsePara(int argc,char **argv)

{
  char *pcVar1;
  
  pcVar1 = argv[1];
  trace_file_name = pcVar1;
  loop = atoi(argv[2]);
  mct_size = atoi(argv[3]);
  return pcVar1 != (char *)0x0;
}

Assistant:

bool parsePara(int argc, char **argv) {
//    for (int i = 1; i < argc; i++) {
//        if (argv[i][0] == '-') {
//            switch (argv[i][1]) {
//                case 'v':
//                    verbose = true;
//                    break;
//                case 's':
//                    single_step = true;
//                    break;
//                default:
//                    return false;
//            }
//        } else {
    trace_file_name = argv[1];
    loop = atoi(argv[2]);
    mct_size = atoi(argv[3]);
//        }
//    }

    return trace_file_name != nullptr;
}